

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  Select *p;
  ExprList *pEVar5;
  uint uVar6;
  int iVar7;
  RenameToken *pToken;
  char *pcVar8;
  char *zName;
  i64 iVar9;
  char *pcVar10;
  i64 iVar11;
  Table *pTVar12;
  Table *pTVar13;
  RenameToken *pRVar14;
  FKey *pFVar15;
  RenameToken **ppRVar16;
  RenameToken *pToken_3;
  long lVar17;
  RenameToken *pRVar18;
  RenameToken *pRVar19;
  uint uVar20;
  Expr *pExpr;
  RenameToken *pToken_2;
  RenameToken *pRVar21;
  sqlite3 *db;
  TriggerStep *pTVar22;
  Index *pIVar23;
  long lVar24;
  bool bVar25;
  RenameCtx sCtx;
  Walker sWalker;
  Parse sParse;
  RenameCtx local_278;
  sqlite3_context *local_250;
  sqlite3 *local_248;
  char *local_240;
  sqlite3_value **local_238;
  char *local_230;
  Walker local_228;
  sqlite3_xauth local_1f0;
  i64 local_1e8;
  char *local_1e0;
  Parse local_1d8;
  
  db = context->pOut->db;
  local_250 = context;
  pcVar8 = (char *)sqlite3ValueText(*argv,'\x01');
  local_230 = (char *)sqlite3ValueText(argv[3],'\x01');
  zName = (char *)sqlite3ValueText(argv[4],'\x01');
  iVar9 = sqlite3VdbeIntValue(argv[5]);
  pcVar10 = (char *)sqlite3ValueText(argv[6],'\x01');
  local_1e8 = sqlite3VdbeIntValue(argv[7]);
  local_238 = argv;
  iVar11 = sqlite3VdbeIntValue(argv[8]);
  uVar20 = (uint)iVar9;
  if (((int)uVar20 < 0 || pcVar10 == (char *)0x0) || (zName == (char *)0x0 || pcVar8 == (char *)0x0)
     ) {
    return;
  }
  local_1f0 = db->xAuth;
  local_240 = pcVar8;
  local_1e0 = pcVar10;
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  pcVar8 = local_230;
  pTVar12 = sqlite3FindTable(db,zName,local_230);
  if ((pTVar12 == (Table *)0x0) || ((int)pTVar12->nCol <= (int)uVar20)) goto LAB_001a201e;
  pcVar10 = pTVar12->aCol[uVar20 & 0x7fffffff].zCnName;
  local_278.pTab = (Table *)0x0;
  local_278.zOld = (char *)0x0;
  local_278.pList = (RenameToken *)0x0;
  uVar6 = 0xffffffff;
  if (uVar20 != (int)pTVar12->iPKey) {
    uVar6 = uVar20;
  }
  local_278._8_8_ = (ulong)uVar6 << 0x20;
  db->xAuth = (sqlite3_xauth)0x0;
  local_248 = db;
  iVar7 = renameParseSql(&local_1d8,pcVar8,db,local_240,(int)iVar11);
  local_228.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_228.walkerDepth = 0;
  local_228.eCode = 0;
  local_228.mWFlags = 0;
  local_228.pParse = &local_1d8;
  local_228.xExprCallback = renameColumnExprCb;
  local_228.xSelectCallback = renameColumnSelectCb;
  local_278.pTab = pTVar12;
  local_228.u.pNC = (NameContext *)&local_278;
  if (iVar7 == 0) {
    if (local_1d8.pNewTable == (Table *)0x0) {
      if (local_1d8.pNewIndex == (Index *)0x0) {
        iVar7 = renameResolveTrigger(&local_1d8);
        if (iVar7 != 0) goto LAB_001a1f7a;
        pTVar22 = (local_1d8.pNewTrigger)->step_list;
        if (pTVar22 != (TriggerStep *)0x0) {
          do {
            if ((pTVar22->zTarget != (char *)0x0) &&
               (pTVar13 = sqlite3LocateTable(&local_1d8,0,pTVar22->zTarget,local_230),
               pTVar13 == pTVar12)) {
              if (pTVar22->pUpsert != (Upsert *)0x0) {
                renameColumnElistNames(&local_1d8,&local_278,pTVar22->pUpsert->pUpsertSet,pcVar10);
              }
              renameColumnIdlistNames(&local_1d8,&local_278,pTVar22->pIdList,pcVar10);
              renameColumnElistNames(&local_1d8,&local_278,pTVar22->pExprList,pcVar10);
            }
            pTVar22 = pTVar22->pNext;
          } while (pTVar22 != (TriggerStep *)0x0);
        }
        if (local_1d8.pTriggerTab == pTVar12) {
          renameColumnIdlistNames(&local_1d8,&local_278,(local_1d8.pNewTrigger)->pColumns,pcVar10);
        }
        renameWalkTrigger(&local_228,local_1d8.pNewTrigger);
      }
      else {
        sqlite3WalkExprList(&local_228,(local_1d8.pNewIndex)->aColExpr);
        if ((local_1d8.pNewIndex)->pPartIdxWhere != (Expr *)0x0) {
          sqlite3WalkExprNN(&local_228,(local_1d8.pNewIndex)->pPartIdxWhere);
        }
      }
    }
    else if ((local_1d8.pNewTable)->eTabType == '\0') {
      if ((local_1d8.pNewTable)->zName != (char *)0x0) {
        lVar17 = 0;
        do {
          bVar1 = zName[lVar17];
          bVar2 = (local_1d8.pNewTable)->zName[lVar17];
          bVar25 = bVar1 == bVar2;
          if (bVar25) {
            if ((ulong)bVar1 == 0) goto LAB_001a1c0d;
          }
          else if (""[bVar1] != ""[bVar2]) goto LAB_001a1c0d;
          lVar17 = lVar17 + 1;
        } while( true );
      }
      bVar25 = false;
LAB_001a1c0d:
      local_278.pTab = local_1d8.pNewTable;
      if (bVar25) {
        if (((int)uVar20 < (int)(local_1d8.pNewTable)->nCol) &&
           (pcVar8 = (local_1d8.pNewTable)->aCol[uVar20 & 0x7fffffff].zCnName,
           local_1d8.pRename != (RenameToken *)0x0 && pcVar8 != (char *)0x0)) {
          pRVar14 = local_1d8.pRename;
          if ((char *)(local_1d8.pRename)->p == pcVar8) {
            ppRVar16 = &local_1d8.pRename;
          }
          else {
            do {
              pRVar19 = pRVar14;
              pRVar14 = pRVar19->pNext;
              if (pRVar14 == (RenameToken *)0x0) goto LAB_001a1c84;
            } while ((char *)pRVar14->p != pcVar8);
            ppRVar16 = &pRVar19->pNext;
          }
          *ppRVar16 = pRVar14->pNext;
          pRVar14->pNext = local_278.pList;
          local_278.nList = local_278.nList + 1;
          local_278.pList = pRVar14;
        }
LAB_001a1c84:
        if (((long)local_278._8_8_ < 0) && (local_1d8.pRename != (RenameToken *)0x0)) {
          pRVar14 = local_1d8.pRename;
          if ((i16 *)(local_1d8.pRename)->p == &(local_1d8.pNewTable)->iPKey) {
            ppRVar16 = &local_1d8.pRename;
          }
          else {
            do {
              pRVar19 = pRVar14;
              pRVar14 = pRVar19->pNext;
              if (pRVar14 == (RenameToken *)0x0) goto LAB_001a1ce1;
            } while ((i16 *)pRVar14->p != &(local_1d8.pNewTable)->iPKey);
            ppRVar16 = &pRVar19->pNext;
          }
          *ppRVar16 = pRVar14->pNext;
          pRVar14->pNext = local_278.pList;
          local_278.nList = local_278.nList + 1;
          local_278.pList = pRVar14;
        }
LAB_001a1ce1:
        sqlite3WalkExprList(&local_228,(local_1d8.pNewTable)->pCheck);
        pIVar23 = (local_1d8.pNewTable)->pIndex;
        if (pIVar23 != (Index *)0x0) {
          do {
            sqlite3WalkExprList(&local_228,pIVar23->aColExpr);
            pIVar23 = pIVar23->pNext;
          } while (pIVar23 != (Index *)0x0);
        }
        if (local_1d8.pNewIndex != (Index *)0x0) {
          pIVar23 = local_1d8.pNewIndex;
          do {
            sqlite3WalkExprList(&local_228,pIVar23->aColExpr);
            pIVar23 = pIVar23->pNext;
          } while (pIVar23 != (Index *)0x0);
        }
        if (0 < (local_1d8.pNewTable)->nCol) {
          lVar24 = 0xc;
          lVar17 = 0;
          do {
            uVar3 = *(ushort *)((long)&(local_1d8.pNewTable)->aCol->zCnName + lVar24);
            if ((((uVar3 == 0) || ((local_1d8.pNewTable)->eTabType != '\0')) ||
                (pEVar5 = ((local_1d8.pNewTable)->u).tab.pDfltList, pEVar5 == (ExprList *)0x0)) ||
               (pEVar5->nExpr < (int)(uint)uVar3)) {
              pExpr = (Expr *)0x0;
            }
            else {
              pExpr = pEVar5->a[uVar3 - 1].pExpr;
            }
            if (pExpr != (Expr *)0x0) {
              sqlite3WalkExprNN(&local_228,pExpr);
            }
            lVar17 = lVar17 + 1;
            lVar24 = lVar24 + 0x10;
          } while (lVar17 < (local_1d8.pNewTable)->nCol);
        }
      }
      pFVar15 = ((local_1d8.pNewTable)->u).tab.pFKey;
      if (pFVar15 != (FKey *)0x0) {
        pRVar14 = local_278.pList;
        iVar7 = local_278.nList;
        do {
          iVar4 = pFVar15->nCol;
          if (0 < (long)iVar4) {
            lVar17 = 0;
            pRVar19 = pRVar14;
            do {
              pRVar14 = pRVar19;
              if ((bVar25) &&
                 (local_1d8.pRename != (RenameToken *)0x0 && pFVar15->aCol[lVar17].iFrom == uVar20))
              {
                ppRVar16 = &local_1d8.pRename;
                pRVar18 = local_1d8.pRename;
                pRVar14 = local_1d8.pRename;
                if ((sColMap *)(local_1d8.pRename)->p != pFVar15->aCol + lVar17) {
                  do {
                    pRVar21 = pRVar18;
                    pRVar18 = pRVar21->pNext;
                    pRVar14 = pRVar19;
                    if (pRVar18 == (RenameToken *)0x0) goto LAB_001a1e60;
                  } while ((sColMap *)pRVar18->p != pFVar15->aCol + lVar17);
                  ppRVar16 = &pRVar21->pNext;
                  pRVar14 = pRVar18;
                }
                *ppRVar16 = pRVar14->pNext;
                pRVar14->pNext = pRVar19;
                iVar7 = iVar7 + 1;
                local_278.nList = iVar7;
                local_278.pList = pRVar14;
              }
LAB_001a1e60:
              if (pFVar15->zTo != (char *)0x0) {
                lVar24 = 0;
                do {
                  bVar1 = pFVar15->zTo[lVar24];
                  if (bVar1 == zName[lVar24]) {
                    if ((ulong)bVar1 == 0) goto LAB_001a1e9e;
                  }
                  else if (""[bVar1] != ""[(byte)zName[lVar24]]) goto LAB_001a1f3b;
                  lVar24 = lVar24 + 1;
                } while( true );
              }
              if (zName == (char *)0x0) {
LAB_001a1e9e:
                pcVar8 = pFVar15->aCol[lVar17].zCol;
                if (pcVar8 == (char *)0x0) {
                  if (pcVar10 == (char *)0x0) {
LAB_001a1ee5:
                    if (local_1d8.pRename != (RenameToken *)0x0 && pcVar8 != (char *)0x0) {
                      ppRVar16 = &local_1d8.pRename;
                      pRVar19 = local_1d8.pRename;
                      if ((char *)(local_1d8.pRename)->p != pcVar8) {
                        do {
                          pRVar18 = pRVar19;
                          pRVar19 = pRVar18->pNext;
                          if (pRVar19 == (RenameToken *)0x0) goto LAB_001a1f3b;
                        } while ((char *)pRVar19->p != pcVar8);
                        ppRVar16 = &pRVar18->pNext;
                      }
                      *ppRVar16 = pRVar19->pNext;
                      pRVar19->pNext = pRVar14;
                      iVar7 = iVar7 + 1;
                      local_278.nList = iVar7;
                      pRVar14 = pRVar19;
                      local_278.pList = pRVar19;
                    }
                  }
                }
                else if (pcVar10 != (char *)0x0) {
                  lVar24 = 0;
                  do {
                    bVar1 = pcVar8[lVar24];
                    if (bVar1 == pcVar10[lVar24]) {
                      if ((ulong)bVar1 == 0) goto LAB_001a1ee5;
                    }
                    else if (""[bVar1] != ""[(byte)pcVar10[lVar24]]) break;
                    lVar24 = lVar24 + 1;
                  } while( true );
                }
              }
LAB_001a1f3b:
              lVar17 = lVar17 + 1;
              pRVar19 = pRVar14;
            } while (lVar17 != iVar4);
          }
          pFVar15 = pFVar15->pNextFrom;
        } while (pFVar15 != (FKey *)0x0);
      }
    }
    else if ((local_1d8.pNewTable)->eTabType == '\x02') {
      p = *(Select **)&(local_1d8.pNewTable)->u;
      p->selFlags = p->selFlags & 0xffdfffff;
      local_1d8.rc = 0;
      sqlite3SelectPrep(&local_1d8,p,(NameContext *)0x0);
      iVar7 = 7;
      if (local_248->mallocFailed == '\0') {
        iVar7 = local_1d8.rc;
      }
      if (iVar7 != 0) goto LAB_001a1f7a;
      sqlite3WalkSelect(&local_228,p);
    }
    iVar7 = renameEditSql(local_250,&local_278,local_240,local_1e0,(int)local_1e8);
  }
LAB_001a1f7a:
  db = local_248;
  if (iVar7 != 0) {
    if ((iVar7 == 1) && ((local_248->flags & 0x10000001) == 1)) {
      sqlite3_result_value(local_250,*local_238);
    }
    else if (local_1d8.zErrMsg == (char *)0x0) {
      sqlite3_result_error_code(local_250,iVar7);
    }
    else {
      renameColumnParseError(local_250,"",local_238[1],local_238[2],&local_1d8);
    }
  }
  renameParseCleanup(&local_1d8);
  pRVar14 = local_278.pList;
  while (pRVar14 != (RenameToken *)0x0) {
    pRVar19 = pRVar14->pNext;
    sqlite3DbFreeNN(db,pRVar14);
    pRVar14 = pRVar19;
  }
  db->xAuth = local_1f0;
LAB_001a201e:
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  return;
}

Assistant:

static void renameColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  RenameCtx sCtx;
  const char *zSql = (const char*)sqlite3_value_text(argv[0]);
  const char *zDb = (const char*)sqlite3_value_text(argv[3]);
  const char *zTable = (const char*)sqlite3_value_text(argv[4]);
  int iCol = sqlite3_value_int(argv[5]);
  const char *zNew = (const char*)sqlite3_value_text(argv[6]);
  int bQuote = sqlite3_value_int(argv[7]);
  int bTemp = sqlite3_value_int(argv[8]);
  const char *zOld;
  int rc;
  Parse sParse;
  Walker sWalker;
  Index *pIdx;
  int i;
  Table *pTab;
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zSql==0 ) return;
  if( zTable==0 ) return;
  if( zNew==0 ) return;
  if( iCol<0 ) return;
  sqlite3BtreeEnterAll(db);
  pTab = sqlite3FindTable(db, zTable, zDb);
  if( pTab==0 || iCol>=pTab->nCol ){
    sqlite3BtreeLeaveAll(db);
    return;
  }
  zOld = pTab->aCol[iCol].zCnName;
  memset(&sCtx, 0, sizeof(sCtx));
  sCtx.iCol = ((iCol==pTab->iPKey) ? -1 : iCol);

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = 0;
#endif
  rc = renameParseSql(&sParse, zDb, db, zSql, bTemp);

  /* Find tokens that need to be replaced. */
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = &sParse;
  sWalker.xExprCallback = renameColumnExprCb;
  sWalker.xSelectCallback = renameColumnSelectCb;
  sWalker.u.pRename = &sCtx;

  sCtx.pTab = pTab;
  if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
  if( sParse.pNewTable ){
    if( IsView(sParse.pNewTable) ){
      Select *pSelect = sParse.pNewTable->u.view.pSelect;
      pSelect->selFlags &= ~SF_View;
      sParse.rc = SQLITE_OK;
      sqlite3SelectPrep(&sParse, pSelect, 0);
      rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
      if( rc==SQLITE_OK ){
        sqlite3WalkSelect(&sWalker, pSelect);
      }
      if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
    }else if( IsOrdinaryTable(sParse.pNewTable) ){
      /* A regular table */
      int bFKOnly = sqlite3_stricmp(zTable, sParse.pNewTable->zName);
      FKey *pFKey;
      sCtx.pTab = sParse.pNewTable;
      if( bFKOnly==0 ){
        if( iCol<sParse.pNewTable->nCol ){
          renameTokenFind(
              &sParse, &sCtx, (void*)sParse.pNewTable->aCol[iCol].zCnName
          );
        }
        if( sCtx.iCol<0 ){
          renameTokenFind(&sParse, &sCtx, (void*)&sParse.pNewTable->iPKey);
        }
        sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
        for(pIdx=sParse.pNewTable->pIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
        for(pIdx=sParse.pNewIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
        for(i=0; i<sParse.pNewTable->nCol; i++){
          Expr *pExpr = sqlite3ColumnExpr(sParse.pNewTable,
                                                  &sParse.pNewTable->aCol[i]);
          sqlite3WalkExpr(&sWalker, pExpr);
        }
#endif
      }

      assert( IsOrdinaryTable(sParse.pNewTable) );
      for(pFKey=sParse.pNewTable->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
        for(i=0; i<pFKey->nCol; i++){
          if( bFKOnly==0 && pFKey->aCol[i].iFrom==iCol ){
            renameTokenFind(&sParse, &sCtx, (void*)&pFKey->aCol[i]);
          }
          if( 0==sqlite3_stricmp(pFKey->zTo, zTable)
           && 0==sqlite3_stricmp(pFKey->aCol[i].zCol, zOld)
          ){
            renameTokenFind(&sParse, &sCtx, (void*)pFKey->aCol[i].zCol);
          }
        }
      }
    }
  }else if( sParse.pNewIndex ){
    sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
    sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
  }else{
    /* A trigger */
    TriggerStep *pStep;
    rc = renameResolveTrigger(&sParse);
    if( rc!=SQLITE_OK ) goto renameColumnFunc_done;

    for(pStep=sParse.pNewTrigger->step_list; pStep; pStep=pStep->pNext){
      if( pStep->zTarget ){
        Table *pTarget = sqlite3LocateTable(&sParse, 0, pStep->zTarget, zDb);
        if( pTarget==pTab ){
          if( pStep->pUpsert ){
            ExprList *pUpsertSet = pStep->pUpsert->pUpsertSet;
            renameColumnElistNames(&sParse, &sCtx, pUpsertSet, zOld);
          }
          renameColumnIdlistNames(&sParse, &sCtx, pStep->pIdList, zOld);
          renameColumnElistNames(&sParse, &sCtx, pStep->pExprList, zOld);
        }
      }
    }


    /* Find tokens to edit in UPDATE OF clause */
    if( sParse.pTriggerTab==pTab ){
      renameColumnIdlistNames(&sParse, &sCtx,sParse.pNewTrigger->pColumns,zOld);
    }

    /* Find tokens to edit in various expressions and selects */
    renameWalkTrigger(&sWalker, sParse.pNewTrigger);
  }

  assert( rc==SQLITE_OK );
  rc = renameEditSql(context, &sCtx, zSql, zNew, bQuote);

renameColumnFunc_done:
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_ERROR && sqlite3WritableSchema(db) ){
      sqlite3_result_value(context, argv[0]);
    }else if( sParse.zErrMsg ){
      renameColumnParseError(context, "", argv[1], argv[2], &sParse);
    }else{
      sqlite3_result_error_code(context, rc);
    }
  }

  renameParseCleanup(&sParse);
  renameTokenFree(db, sCtx.pList);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  sqlite3BtreeLeaveAll(db);
}